

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteHeader(ColladaExporter *this)

{
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  aiNode *paVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  tm *__tp;
  aiNode *this_00;
  aiNode **ppaVar9;
  ostream *poVar10;
  aiMetadata *this_01;
  allocator<char> local_4f1;
  aiScene *scene;
  string local_4d0;
  float local_4ac;
  aiQuaterniont<float> local_4a8;
  string up_axis;
  aiVector3t<float> local_478;
  aiVector3t<float> local_468;
  char date_str [20];
  time_t date;
  aiString value;
  
  if ((WriteHeader()::epsilon == '\0') && (iVar8 = __cxa_guard_acquire(), iVar8 != 0)) {
    WriteHeader::epsilon = 1.1920929e-07;
    __cxa_guard_release();
  }
  if ((WriteHeader()::x_rot == '\0') && (iVar8 = __cxa_guard_acquire(), iVar8 != 0)) {
    value.length = 0;
    value.data[0] = '\0';
    value.data[1] = '\0';
    value.data[2] = -0x80;
    value.data[3] = -0x41;
    value.data[4] = '\0';
    value.data[5] = '\0';
    value.data[6] = '\0';
    value.data[7] = '\0';
    value.data[8] = '\0';
    value.data[9] = '\0';
    value.data[10] = -0x80;
    value.data[0xb] = '?';
    value.data[0xc] = '\0';
    value.data[0xd] = '\0';
    value.data[0xe] = '\0';
    value.data[0xf] = '\0';
    value.data[0x10] = '\0';
    value.data[0x11] = '\0';
    value.data[0x12] = '\0';
    value.data[0x13] = '\0';
    value.data[0x14] = '\0';
    value.data[0x15] = '\0';
    value.data[0x16] = '\0';
    value.data[0x17] = '\0';
    value.data[0x18] = '\0';
    value.data[0x19] = '\0';
    value.data[0x1a] = '\0';
    value.data[0x1b] = '\0';
    value.data[0x1c] = '\0';
    value.data[0x1d] = '\0';
    value.data[0x1e] = -0x80;
    value.data[0x1f] = '?';
    aiQuaterniont<float>::aiQuaterniont(&WriteHeader::x_rot,(aiMatrix3x3t<float> *)&value);
    __cxa_guard_release();
  }
  if ((WriteHeader()::y_rot == '\0') && (iVar8 = __cxa_guard_acquire(), iVar8 != 0)) {
    value.length = 0x3f800000;
    value.data[0] = '\0';
    value.data[1] = '\0';
    value.data[2] = '\0';
    value.data[3] = '\0';
    value.data[4] = '\0';
    value.data[5] = '\0';
    value.data[6] = '\0';
    value.data[7] = '\0';
    value.data[8] = '\0';
    value.data[9] = '\0';
    value.data[10] = '\0';
    value.data[0xb] = '\0';
    value.data[0xc] = '\0';
    value.data[0xd] = '\0';
    value.data[0xe] = -0x80;
    value.data[0xf] = '?';
    value.data[0x10] = '\0';
    value.data[0x11] = '\0';
    value.data[0x12] = '\0';
    value.data[0x13] = '\0';
    value.data[0x14] = '\0';
    value.data[0x15] = '\0';
    value.data[0x16] = '\0';
    value.data[0x17] = '\0';
    value.data[0x18] = '\0';
    value.data[0x19] = '\0';
    value.data[0x1a] = '\0';
    value.data[0x1b] = '\0';
    value.data[0x1c] = '\0';
    value.data[0x1d] = '\0';
    value.data[0x1e] = -0x80;
    value.data[0x1f] = '?';
    aiQuaterniont<float>::aiQuaterniont(&WriteHeader::y_rot,(aiMatrix3x3t<float> *)&value);
    __cxa_guard_release();
  }
  if ((WriteHeader()::z_rot == '\0') && (iVar8 = __cxa_guard_acquire(), iVar8 != 0)) {
    value.length = 0x3f800000;
    value.data[0] = '\0';
    value.data[1] = '\0';
    value.data[2] = '\0';
    value.data[3] = '\0';
    value.data[4] = '\0';
    value.data[5] = '\0';
    value.data[6] = '\0';
    value.data[7] = '\0';
    value.data[8] = '\0';
    value.data[9] = '\0';
    value.data[10] = '\0';
    value.data[0xb] = '\0';
    value.data[0xc] = '\0';
    value.data[0xd] = '\0';
    value.data[0xe] = '\0';
    value.data[0xf] = '\0';
    value.data[0x10] = '\0';
    value.data[0x11] = '\0';
    value.data[0x12] = -0x80;
    value.data[0x13] = '?';
    value.data[0x14] = '\0';
    value.data[0x15] = '\0';
    value.data[0x16] = '\0';
    value.data[0x17] = '\0';
    value.data[0x18] = '\0';
    value.data[0x19] = '\0';
    value.data[0x1a] = -0x80;
    value.data[0x1b] = -0x41;
    value.data[0x1c] = '\0';
    value.data[0x1d] = '\0';
    value.data[0x1e] = '\0';
    value.data[0x1f] = '\0';
    aiQuaterniont<float>::aiQuaterniont(&WriteHeader::z_rot,(aiMatrix3x3t<float> *)&value);
    __cxa_guard_release();
  }
  date = time((time_t *)0x0);
  __tp = localtime(&date);
  strftime(date_str,0x14,"%Y-%m-%dT%H:%M:%S",__tp);
  local_468.x = 0.0;
  local_468.y = 0.0;
  local_468.z = 0.0;
  local_478.x = 0.0;
  local_478.y = 0.0;
  local_4a8.w = 1.0;
  local_4a8.x = 0.0;
  local_4a8.y = 0.0;
  local_4a8.z = 0.0;
  local_478.z = 0.0;
  aiMatrix4x4t<float>::Decompose
            (&this->mScene->mRootNode->mTransformation,&local_468,&local_4a8,&local_478);
  aiQuaterniont<float>::Normalize(&local_4a8);
  local_4ac = 1.0;
  bVar6 = 1;
  if (((ABS(local_468.x - local_468.y) <= WriteHeader::epsilon) &&
      (ABS(local_468.x - local_468.z) <= WriteHeader::epsilon)) &&
     (ABS(local_468.y - local_468.z) <= WriteHeader::epsilon)) {
    local_4ac = (local_468.z + local_468.y + local_468.x) / 3.0;
    bVar6 = 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&up_axis,"Y_UP",(allocator<char> *)&value);
  bVar7 = aiQuaterniont<float>::Equal(&local_4a8,&WriteHeader::x_rot,WriteHeader::epsilon);
  if ((bVar7) ||
     (bVar7 = aiQuaterniont<float>::Equal(&local_4a8,&WriteHeader::y_rot,WriteHeader::epsilon),
     bVar7)) {
LAB_00328ed4:
    std::__cxx11::string::assign((char *)&up_axis);
    bVar5 = bVar6;
  }
  else {
    bVar7 = aiQuaterniont<float>::Equal(&local_4a8,&WriteHeader::z_rot,WriteHeader::epsilon);
    bVar5 = 1;
    if (bVar7) goto LAB_00328ed4;
  }
  value.length = 0;
  value.data[0] = '\0';
  value.data[1] = '\0';
  value.data[2] = '\0';
  value.data[3] = '\0';
  value.data[4] = '\0';
  value.data[5] = '\0';
  value.data[6] = '\0';
  value.data[7] = '\0';
  bVar7 = aiVector3t<float>::Equal(&local_478,(aiVector3t<float> *)&value,1e-06);
  if ((bool)(!bVar7 | bVar5 | this->mScene->mRootNode->mNumChildren == 0)) {
    SceneCombiner::CopyScene(&scene,this->mScene,true);
    this_00 = (aiNode *)operator_new(0x478);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"Scene",(allocator<char> *)&local_4d0);
    aiNode::aiNode(this_00,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    this_00->mNumChildren = 1;
    ppaVar9 = (aiNode **)operator_new__(8);
    this_00->mChildren = ppaVar9;
    paVar4 = scene->mRootNode;
    *ppaVar9 = paVar4;
    paVar4->mParent = this_00;
    scene->mRootNode = this_00;
    this->mScene = scene;
    this->mSceneOwned = true;
    std::__cxx11::string::assign((char *)&up_axis);
    local_4ac = 1.0;
  }
  puVar1 = &this->field_0x38;
  psVar2 = &this->startstr;
  poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar10 = std::operator<<(poVar10,"<asset>");
  psVar3 = &this->endstr;
  std::operator<<(poVar10,(string *)psVar3);
  PushTag(this);
  poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar10 = std::operator<<(poVar10,"<contributor>");
  std::operator<<(poVar10,(string *)psVar3);
  PushTag(this);
  this_01 = this->mScene->mMetaData;
  if (this_01 == (aiMetadata *)0x0) {
    this_01 = this->mScene->mRootNode->mMetaData;
  }
  value.length = 0;
  value.data._0_4_ = value.data._0_4_ & 0xffffff00;
  memset(value.data + 1,0x1b,0x3ff);
  if (this_01 == (aiMetadata *)0x0) {
LAB_00329150:
    poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar10 = std::operator<<(poVar10,"<author>");
    poVar10 = std::operator<<(poVar10,"Assimp");
    poVar10 = std::operator<<(poVar10,"</author>");
    std::operator<<(poVar10,(string *)psVar3);
    if (this_01 != (aiMetadata *)0x0) goto LAB_0032919c;
LAB_0032925d:
    poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar10 = std::operator<<(poVar10,"<authoring_tool>");
    poVar10 = std::operator<<(poVar10,"Assimp Exporter");
    poVar10 = std::operator<<(poVar10,"</authoring_tool>");
    std::operator<<(poVar10,(string *)psVar3);
    if (this_01 != (aiMetadata *)0x0) goto LAB_003292a9;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scene,"Author",(allocator<char> *)&local_4d0);
    bVar7 = aiMetadata::Get<aiString>(this_01,(string *)&scene,&value);
    std::__cxx11::string::~string((string *)&scene);
    if (!bVar7) goto LAB_00329150;
    poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar10 = std::operator<<(poVar10,"<author>");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,value.data,&local_4f1);
    XMLEscape((string *)&scene,&local_4d0);
    poVar10 = std::operator<<(poVar10,(string *)&scene);
    poVar10 = std::operator<<(poVar10,"</author>");
    std::operator<<(poVar10,(string *)psVar3);
    std::__cxx11::string::~string((string *)&scene);
    std::__cxx11::string::~string((string *)&local_4d0);
LAB_0032919c:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scene,"SourceAsset_Generator",(allocator<char> *)&local_4d0);
    bVar7 = aiMetadata::Get<aiString>(this_01,(string *)&scene,&value);
    std::__cxx11::string::~string((string *)&scene);
    if (!bVar7) goto LAB_0032925d;
    poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar10 = std::operator<<(poVar10,"<authoring_tool>");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,value.data,&local_4f1);
    XMLEscape((string *)&scene,&local_4d0);
    poVar10 = std::operator<<(poVar10,(string *)&scene);
    poVar10 = std::operator<<(poVar10,"</authoring_tool>");
    std::operator<<(poVar10,(string *)psVar3);
    std::__cxx11::string::~string((string *)&scene);
    std::__cxx11::string::~string((string *)&local_4d0);
LAB_003292a9:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scene,"Comments",(allocator<char> *)&local_4d0);
    bVar7 = aiMetadata::Get<aiString>(this_01,(string *)&scene,&value);
    std::__cxx11::string::~string((string *)&scene);
    if (bVar7) {
      poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar10 = std::operator<<(poVar10,"<comments>");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,value.data,&local_4f1)
      ;
      XMLEscape((string *)&scene,&local_4d0);
      poVar10 = std::operator<<(poVar10,(string *)&scene);
      poVar10 = std::operator<<(poVar10,"</comments>");
      std::operator<<(poVar10,(string *)psVar3);
      std::__cxx11::string::~string((string *)&scene);
      std::__cxx11::string::~string((string *)&local_4d0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scene,"SourceAsset_Copyright",(allocator<char> *)&local_4d0);
    bVar7 = aiMetadata::Get<aiString>(this_01,(string *)&scene,&value);
    std::__cxx11::string::~string((string *)&scene);
    if (bVar7) {
      poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar10 = std::operator<<(poVar10,"<copyright>");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,value.data,&local_4f1)
      ;
      XMLEscape((string *)&scene,&local_4d0);
      poVar10 = std::operator<<(poVar10,(string *)&scene);
      poVar10 = std::operator<<(poVar10,"</copyright>");
      std::operator<<(poVar10,(string *)psVar3);
      std::__cxx11::string::~string((string *)&scene);
      std::__cxx11::string::~string((string *)&local_4d0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scene,"SourceData",(allocator<char> *)&local_4d0);
    bVar7 = aiMetadata::Get<aiString>(this_01,(string *)&scene,&value);
    std::__cxx11::string::~string((string *)&scene);
    if (bVar7) {
      poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar10 = std::operator<<(poVar10,"<source_data>");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,value.data,&local_4f1)
      ;
      XMLEscape((string *)&scene,&local_4d0);
      poVar10 = std::operator<<(poVar10,(string *)&scene);
      poVar10 = std::operator<<(poVar10,"</source_data>");
      std::operator<<(poVar10,(string *)psVar3);
      std::__cxx11::string::~string((string *)&scene);
      std::__cxx11::string::~string((string *)&local_4d0);
    }
  }
  PopTag(this);
  poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar10 = std::operator<<(poVar10,"</contributor>");
  std::operator<<(poVar10,(string *)psVar3);
  if (this_01 != (aiMetadata *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scene,"Created",(allocator<char> *)&local_4d0);
    bVar7 = aiMetadata::Get<aiString>(this_01,(string *)&scene,&value);
    std::__cxx11::string::~string((string *)&scene);
    if (bVar7) {
      poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar10 = std::operator<<(poVar10,"<created>");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,value.data,&local_4f1)
      ;
      XMLEscape((string *)&scene,&local_4d0);
      poVar10 = std::operator<<(poVar10,(string *)&scene);
      poVar10 = std::operator<<(poVar10,"</created>");
      std::operator<<(poVar10,(string *)psVar3);
      std::__cxx11::string::~string((string *)&scene);
      std::__cxx11::string::~string((string *)&local_4d0);
      goto LAB_00329615;
    }
  }
  poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar10 = std::operator<<(poVar10,"<created>");
  poVar10 = std::operator<<(poVar10,date_str);
  poVar10 = std::operator<<(poVar10,"</created>");
  std::operator<<(poVar10,(string *)psVar3);
LAB_00329615:
  poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar10 = std::operator<<(poVar10,"<modified>");
  poVar10 = std::operator<<(poVar10,date_str);
  poVar10 = std::operator<<(poVar10,"</modified>");
  std::operator<<(poVar10,(string *)psVar3);
  if (this_01 != (aiMetadata *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scene,"Keywords",(allocator<char> *)&local_4d0);
    bVar7 = aiMetadata::Get<aiString>(this_01,(string *)&scene,&value);
    std::__cxx11::string::~string((string *)&scene);
    if (bVar7) {
      poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar10 = std::operator<<(poVar10,"<keywords>");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,value.data,&local_4f1)
      ;
      XMLEscape((string *)&scene,&local_4d0);
      poVar10 = std::operator<<(poVar10,(string *)&scene);
      poVar10 = std::operator<<(poVar10,"</keywords>");
      std::operator<<(poVar10,(string *)psVar3);
      std::__cxx11::string::~string((string *)&scene);
      std::__cxx11::string::~string((string *)&local_4d0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scene,"Revision",(allocator<char> *)&local_4d0);
    bVar7 = aiMetadata::Get<aiString>(this_01,(string *)&scene,&value);
    std::__cxx11::string::~string((string *)&scene);
    if (bVar7) {
      poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar10 = std::operator<<(poVar10,"<revision>");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,value.data,&local_4f1)
      ;
      XMLEscape((string *)&scene,&local_4d0);
      poVar10 = std::operator<<(poVar10,(string *)&scene);
      poVar10 = std::operator<<(poVar10,"</revision>");
      std::operator<<(poVar10,(string *)psVar3);
      std::__cxx11::string::~string((string *)&scene);
      std::__cxx11::string::~string((string *)&local_4d0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scene,"Subject",(allocator<char> *)&local_4d0);
    bVar7 = aiMetadata::Get<aiString>(this_01,(string *)&scene,&value);
    std::__cxx11::string::~string((string *)&scene);
    if (bVar7) {
      poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar10 = std::operator<<(poVar10,"<subject>");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,value.data,&local_4f1)
      ;
      XMLEscape((string *)&scene,&local_4d0);
      poVar10 = std::operator<<(poVar10,(string *)&scene);
      poVar10 = std::operator<<(poVar10,"</subject>");
      std::operator<<(poVar10,(string *)psVar3);
      std::__cxx11::string::~string((string *)&scene);
      std::__cxx11::string::~string((string *)&local_4d0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&scene,"Title",(allocator<char> *)&local_4d0);
    bVar7 = aiMetadata::Get<aiString>(this_01,(string *)&scene,&value);
    std::__cxx11::string::~string((string *)&scene);
    if (bVar7) {
      poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar10 = std::operator<<(poVar10,"<title>");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,value.data,&local_4f1)
      ;
      XMLEscape((string *)&scene,&local_4d0);
      poVar10 = std::operator<<(poVar10,(string *)&scene);
      poVar10 = std::operator<<(poVar10,"</title>");
      std::operator<<(poVar10,(string *)psVar3);
      std::__cxx11::string::~string((string *)&scene);
      std::__cxx11::string::~string((string *)&local_4d0);
    }
  }
  poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar10 = std::operator<<(poVar10,"<unit name=\"meter\" meter=\"");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_4ac);
  poVar10 = std::operator<<(poVar10,"\" />");
  std::operator<<(poVar10,(string *)psVar3);
  poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar10 = std::operator<<(poVar10,"<up_axis>");
  poVar10 = std::operator<<(poVar10,(string *)&up_axis);
  poVar10 = std::operator<<(poVar10,"</up_axis>");
  std::operator<<(poVar10,(string *)psVar3);
  PopTag(this);
  poVar10 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar10 = std::operator<<(poVar10,"</asset>");
  std::operator<<(poVar10,(string *)psVar3);
  std::__cxx11::string::~string((string *)&up_axis);
  return;
}

Assistant:

void ColladaExporter::WriteHeader() {
    static const ai_real epsilon = Math::getEpsilon<ai_real>();
    static const aiQuaternion x_rot(aiMatrix3x3(
        0, -1,  0,
        1,  0,  0,
        0,  0,  1));
    static const aiQuaternion y_rot(aiMatrix3x3(
        1,  0,  0,
        0,  1,  0,
        0,  0,  1));
    static const aiQuaternion z_rot(aiMatrix3x3(
        1,  0,  0,
        0,  0,  1,
        0, -1,  0));

    static const unsigned int date_nb_chars = 20;
    char date_str[date_nb_chars];
    std::time_t date = std::time(NULL);
    std::strftime(date_str, date_nb_chars, "%Y-%m-%dT%H:%M:%S", std::localtime(&date));

    aiVector3D scaling;
    aiQuaternion rotation;
    aiVector3D position;
    mScene->mRootNode->mTransformation.Decompose(scaling, rotation, position);
    rotation.Normalize();

    bool add_root_node = false;

    ai_real scale = 1.0;
    if(std::abs(scaling.x - scaling.y) <= epsilon && std::abs(scaling.x - scaling.z) <= epsilon && std::abs(scaling.y - scaling.z) <= epsilon) {
        scale = (ai_real) ((((double) scaling.x) + ((double) scaling.y) + ((double) scaling.z)) / 3.0);
    } else {
        add_root_node = true;
    }

    std::string up_axis = "Y_UP";
    if(rotation.Equal(x_rot, epsilon)) {
        up_axis = "X_UP";
    } else if(rotation.Equal(y_rot, epsilon)) {
        up_axis = "Y_UP";
    } else if(rotation.Equal(z_rot, epsilon)) {
        up_axis = "Z_UP";
    } else {
        add_root_node = true;
    }

    if(! position.Equal(aiVector3D(0, 0, 0))) {
        add_root_node = true;
    }

    if(mScene->mRootNode->mNumChildren == 0) {
        add_root_node = true;
    }

    if(add_root_node) {
        aiScene* scene;
        SceneCombiner::CopyScene(&scene, mScene);

        aiNode* root = new aiNode("Scene");

        root->mNumChildren = 1;
        root->mChildren = new aiNode*[root->mNumChildren];

        root->mChildren[0] = scene->mRootNode;
        scene->mRootNode->mParent = root;
        scene->mRootNode = root;

        mScene = scene;
        mSceneOwned = true;

        up_axis = "Y_UP";
        scale = 1.0;
    }

    mOutput << startstr << "<asset>" << endstr;
    PushTag();
    mOutput << startstr << "<contributor>" << endstr;
    PushTag();

    // If no Scene metadata, use root node metadata
    aiMetadata* meta = mScene->mMetaData;
    if (nullptr == meta) {
        meta = mScene->mRootNode->mMetaData;
    }

    aiString value;
    if (!meta || !meta->Get("Author", value)) {
        mOutput << startstr << "<author>" << "Assimp" << "</author>" << endstr;
    } else {
        mOutput << startstr << "<author>" << XMLEscape(value.C_Str()) << "</author>" << endstr;
    }

    if (nullptr == meta || !meta->Get(AI_METADATA_SOURCE_GENERATOR, value)) {
        mOutput << startstr << "<authoring_tool>" << "Assimp Exporter" << "</authoring_tool>" << endstr;
    } else {
        mOutput << startstr << "<authoring_tool>" << XMLEscape(value.C_Str()) << "</authoring_tool>" << endstr;
    }

    if (meta) {
        if (meta->Get("Comments", value)) {
            mOutput << startstr << "<comments>" << XMLEscape(value.C_Str()) << "</comments>" << endstr;
        }
        if (meta->Get(AI_METADATA_SOURCE_COPYRIGHT, value)) {
            mOutput << startstr << "<copyright>" << XMLEscape(value.C_Str()) << "</copyright>" << endstr;
        }
        if (meta->Get("SourceData", value)) {
            mOutput << startstr << "<source_data>" << XMLEscape(value.C_Str()) << "</source_data>" << endstr;
        }
    }

    PopTag();
    mOutput << startstr << "</contributor>" << endstr;

    if (nullptr == meta || !meta->Get("Created", value)) {
        mOutput << startstr << "<created>" << date_str << "</created>" << endstr;
    } else {
        mOutput << startstr << "<created>" << XMLEscape(value.C_Str()) << "</created>" << endstr;
    }

    // Modified date is always the date saved
    mOutput << startstr << "<modified>" << date_str << "</modified>" << endstr;

    if (meta) {
        if (meta->Get("Keywords", value)) {
            mOutput << startstr << "<keywords>" << XMLEscape(value.C_Str()) << "</keywords>" << endstr;
        }
        if (meta->Get("Revision", value)) {
            mOutput << startstr << "<revision>" << XMLEscape(value.C_Str()) << "</revision>" << endstr;
        }
        if (meta->Get("Subject", value)) {
            mOutput << startstr << "<subject>" << XMLEscape(value.C_Str()) << "</subject>" << endstr;
        }
        if (meta->Get("Title", value)) {
            mOutput << startstr << "<title>" << XMLEscape(value.C_Str()) << "</title>" << endstr;
        }
    }

    mOutput << startstr << "<unit name=\"meter\" meter=\"" << scale << "\" />" << endstr;
    mOutput << startstr << "<up_axis>" << up_axis << "</up_axis>" << endstr;
    PopTag();
    mOutput << startstr << "</asset>" << endstr;
}